

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_node.cpp
# Opt level: O0

void dumpToList_prefix(Node *n,vector<rengine::Node_*,_std::allocator<rengine::Node_*>_> *list)

{
  Node *local_20;
  Node *c;
  vector<rengine::Node_*,_std::allocator<rengine::Node_*>_> *list_local;
  Node *n_local;
  
  list_local = (vector<rengine::Node_*,_std::allocator<rengine::Node_*>_> *)n;
  std::vector<rengine::Node_*,_std::allocator<rengine::Node_*>_>::push_back
            (list,(value_type *)&list_local);
  for (local_20 = rengine::Node::child((Node *)list_local); local_20 != (Node *)0x0;
      local_20 = rengine::Node::sibling(local_20)) {
    dumpToList_prefix(local_20,list);
  }
  return;
}

Assistant:

static void dumpToList_prefix(Node *n, std::vector<Node *> &list)
{
    list.push_back(n);
    Node *c = n->child();
    while (c) {
        dumpToList_prefix(c, list);
        c = c->sibling();
    }
}